

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O2

void do_cntp(DisasContext_conflict1 *s,TCGv_i64 val,int esz,int pn,int pg)

{
  int iVar1;
  TCGContext_conflict1 *tcg_ctx;
  uintptr_t o_2;
  TCGv_i64 ret;
  TCGv_ptr ret_00;
  TCGv_ptr ret_01;
  TCGv_i32 pTVar2;
  byte bVar3;
  uint uVar4;
  uintptr_t o;
  uintptr_t o_1;
  TCGTemp *local_48;
  TCGTemp *local_40;
  TCGTemp *local_38;
  
  tcg_ctx = s->uc->tcg_ctx;
  iVar1 = s->sve_len;
  uVar4 = iVar1 >> 3;
  if (uVar4 < 9) {
    tcg_gen_ld_i64_aarch64(tcg_ctx,val,tcg_ctx->cpu_env,(long)(pn * 0x20 + 0x2c10));
    if (pn != pg) {
      ret = tcg_temp_new_i64(tcg_ctx);
      tcg_gen_ld_i64_aarch64(tcg_ctx,ret,tcg_ctx->cpu_env,(long)(pg * 0x20 + 0x2c10));
      tcg_gen_and_i64_aarch64(tcg_ctx,val,val,ret);
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
    }
    bVar3 = -((byte)iVar1 & 0xf8);
    tcg_gen_andi_i64_aarch64
              (tcg_ctx,val,val,(pred_esz_masks_aarch64[esz] << (bVar3 & 0x3f)) >> (bVar3 & 0x3f));
    tcg_gen_ctpop_i64_aarch64(tcg_ctx,val,val);
    return;
  }
  ret_00 = tcg_temp_new_ptr(tcg_ctx);
  ret_01 = tcg_temp_new_ptr(tcg_ctx);
  tcg_gen_addi_i64_aarch64
            (tcg_ctx,(TCGv_i64)ret_00,(TCGv_i64)tcg_ctx->cpu_env,(long)(pn * 0x20 + 0x2c10));
  tcg_gen_addi_i64_aarch64
            (tcg_ctx,(TCGv_i64)ret_01,(TCGv_i64)tcg_ctx->cpu_env,(long)(pg * 0x20 + 0x2c10));
  pTVar2 = tcg_const_i32_aarch64(tcg_ctx,(esz & 3U) << 10 | uVar4 - 2 & 0xfffff3ff);
  local_48 = (TCGTemp *)(ret_00 + (long)tcg_ctx);
  local_40 = (TCGTemp *)(ret_01 + (long)tcg_ctx);
  local_38 = (TCGTemp *)(pTVar2 + (long)tcg_ctx);
  tcg_gen_callN_aarch64
            (tcg_ctx,helper_sve_cntp_aarch64,(TCGTemp *)(val + (long)tcg_ctx),3,&local_48);
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret_01 + (long)tcg_ctx));
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
  return;
}

Assistant:

static void do_cntp(DisasContext *s, TCGv_i64 val, int esz, int pn, int pg)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    unsigned psz = pred_full_reg_size(s);

    if (psz <= 8) {
        uint64_t psz_mask;

        tcg_gen_ld_i64(tcg_ctx, val, tcg_ctx->cpu_env, pred_full_reg_offset(s, pn));
        if (pn != pg) {
            TCGv_i64 g = tcg_temp_new_i64(tcg_ctx);
            tcg_gen_ld_i64(tcg_ctx, g, tcg_ctx->cpu_env, pred_full_reg_offset(s, pg));
            tcg_gen_and_i64(tcg_ctx, val, val, g);
            tcg_temp_free_i64(tcg_ctx, g);
        }

        /* Reduce the pred_esz_masks value simply to reduce the
         * size of the code generated here.
         */
        psz_mask = MAKE_64BIT_MASK(0, psz * 8);
        tcg_gen_andi_i64(tcg_ctx, val, val, pred_esz_masks[esz] & psz_mask);

        tcg_gen_ctpop_i64(tcg_ctx, val, val);
    } else {
        TCGv_ptr t_pn = tcg_temp_new_ptr(tcg_ctx);
        TCGv_ptr t_pg = tcg_temp_new_ptr(tcg_ctx);
        unsigned desc;
        TCGv_i32 t_desc;

        desc = psz - 2;
        desc = deposit32(desc, SIMD_DATA_SHIFT, 2, esz);

        tcg_gen_addi_ptr(tcg_ctx, t_pn, tcg_ctx->cpu_env, pred_full_reg_offset(s, pn));
        tcg_gen_addi_ptr(tcg_ctx, t_pg, tcg_ctx->cpu_env, pred_full_reg_offset(s, pg));
        t_desc = tcg_const_i32(tcg_ctx, desc);

        gen_helper_sve_cntp(tcg_ctx, val, t_pn, t_pg, t_desc);
        tcg_temp_free_ptr(tcg_ctx, t_pn);
        tcg_temp_free_ptr(tcg_ctx, t_pg);
        tcg_temp_free_i32(tcg_ctx, t_desc);
    }
}